

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_addEquivalenceFirstParameterNullptr_Test::
~Variable_addEquivalenceFirstParameterNullptr_Test
          (Variable_addEquivalenceFirstParameterNullptr_Test *this)

{
  Variable_addEquivalenceFirstParameterNullptr_Test *this_local;
  
  ~Variable_addEquivalenceFirstParameterNullptr_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Variable, addEquivalenceFirstParameterNullptr)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();

    m->setName("modelName");
    comp1->setName("component1");

    v1->setName("variable1");

    v1->setUnits("dimensionless");

    comp1->addVariable(v1);

    m->addComponent(comp1);

    EXPECT_FALSE(libcellml::Variable::addEquivalence(nullptr, v1));
}